

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O3

bool EV_SlidingDoor(line_t_conflict *line,AActor *actor,int tag,int speed,int delay)

{
  DSectorEffect *pDVar1;
  line_t_conflict *line_00;
  sector_t_conflict *psVar2;
  PClass *pPVar3;
  bool bVar4;
  short sVar5;
  uint uVar6;
  int iVar7;
  FDoorAnimation *pFVar8;
  DAnimatedDoor *pDVar9;
  undefined4 extraout_var;
  long lVar11;
  FSectorTagIterator it;
  FSectorTagIterator local_38;
  PClass *pPVar10;
  
  pPVar3 = DAnimatedDoor::RegistrationInfo.MyClass;
  if (tag != 0) {
    local_38.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    bVar4 = false;
    local_38.searchtag = tag;
LAB_003eb910:
    uVar6 = FSectorTagIterator::Next(&local_38);
    if ((int)uVar6 < 0) {
      return bVar4;
    }
    psVar2 = sectors + uVar6;
    pDVar1 = sectors[uVar6].ceilingdata.field_0.p;
    if (pDVar1 != (DSectorEffect *)0x0) goto code_r0x003eb93d;
    goto LAB_003eb94e;
  }
  psVar2 = line->backsector;
  pDVar1 = (psVar2->ceilingdata).field_0.p;
  if (pDVar1 == (DSectorEffect *)0x0) {
LAB_003eba7d:
    pFVar8 = FTextureManager::FindAnimatedDoor
                       (&TexMan,(FTextureID)line->sidedef[0]->textures[0].texture.texnum);
    if (pFVar8 == (FDoorAnimation *)0x0) {
      return false;
    }
    pDVar9 = (DAnimatedDoor *)
             M_Malloc_Dbg(0x88,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
    DAnimatedDoor::DAnimatedDoor(pDVar9,(sector_t *)psVar2,line,speed,delay,pFVar8);
    return true;
  }
  if (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (psVar2->ceilingdata).field_0.p = (DSectorEffect *)0x0;
    goto LAB_003eba7d;
  }
  if (actor->player == (player_t *)0x0) {
    return false;
  }
  pPVar10 = (pDVar1->super_DThinker).super_DObject.Class;
  if (pPVar10 == (PClass *)0x0) {
    iVar7 = (**(pDVar1->super_DThinker).super_DObject._vptr_DObject)(pDVar1);
    pPVar10 = (PClass *)CONCAT44(extraout_var,iVar7);
    (pDVar1->super_DThinker).super_DObject.Class = pPVar10;
  }
  if (pPVar10 != pPVar3) {
    return false;
  }
  pDVar9 = (DAnimatedDoor *)(psVar2->ceilingdata).field_0.p;
  if (pDVar9 != (DAnimatedDoor *)0x0) {
    if (((pDVar9->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.
         super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003eba59;
    (psVar2->ceilingdata).field_0.p = (DSectorEffect *)0x0;
  }
  pDVar9 = (DAnimatedDoor *)0x0;
LAB_003eba59:
  if (pDVar9->m_Status != 1) {
    return false;
  }
  bVar4 = DAnimatedDoor::StartClosing(pDVar9);
  return bVar4;
code_r0x003eb93d:
  if (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (psVar2->ceilingdata).field_0.p = (DSectorEffect *)0x0;
LAB_003eb94e:
    sVar5 = psVar2->linecount;
    if (0 < sVar5) {
      lVar11 = 0;
      do {
        line_00 = psVar2->lines[lVar11];
        if (line_00->backsector != (sector_t_conflict *)0x0) {
          pFVar8 = FTextureManager::FindAnimatedDoor
                             (&TexMan,(FTextureID)line_00->sidedef[0]->textures[0].texture.texnum);
          if (pFVar8 != (FDoorAnimation *)0x0) {
            pDVar9 = (DAnimatedDoor *)
                     M_Malloc_Dbg(0x88,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
            bVar4 = true;
            DAnimatedDoor::DAnimatedDoor(pDVar9,(sector_t *)psVar2,line_00,speed,delay,pFVar8);
            break;
          }
          sVar5 = psVar2->linecount;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < sVar5);
    }
  }
  goto LAB_003eb910;
}

Assistant:

bool EV_SlidingDoor (line_t *line, AActor *actor, int tag, int speed, int delay)
{
	sector_t *sec;
	int secnum;
	bool rtn;

	secnum = -1;
	rtn = false;

	if (tag == 0)
	{
		// Manual sliding door
		sec = line->backsector;

		// Make sure door isn't already being animated
		if (sec->ceilingdata != NULL)
		{
			if (actor->player == NULL)
				return false;

			if (sec->ceilingdata->IsA (RUNTIME_CLASS(DAnimatedDoor)))
			{
				DAnimatedDoor *door = barrier_cast<DAnimatedDoor *>(sec->ceilingdata);
				if (door->m_Status == DAnimatedDoor::Waiting)
				{
					return door->StartClosing();
				}
			}
			return false;
		}
		FDoorAnimation *anim = TexMan.FindAnimatedDoor (line->sidedef[0]->GetTexture(side_t::top));
		if (anim != NULL)
		{
			new DAnimatedDoor (sec, line, speed, delay, anim);
			return true;
		}
		return false;
	}

	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sec = &sectors[secnum];
		if (sec->ceilingdata != NULL)
		{
			continue;
		}

		for (int i = 0; tag != 0 && i < sec->linecount; ++i)
		{
			line = sec->lines[i];
			if (line->backsector == NULL)
			{
				continue;
			}
			FDoorAnimation *anim = TexMan.FindAnimatedDoor (line->sidedef[0]->GetTexture(side_t::top));
			if (anim != NULL)
			{
				rtn = true;
				new DAnimatedDoor (sec, line, speed, delay, anim);
				break;
			}
		}
	}
	return rtn;
}